

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O3

void __thiscall QMdiArea::paintEvent(QMdiArea *this,QPaintEvent *paintEvent)

{
  long lVar1;
  QBrush *pQVar2;
  QBrush *pQVar3;
  QPaintDevice *pQVar4;
  QRect *exposedRect;
  long in_FS_OFFSET;
  QPainter painter;
  QRect local_30;
  
  local_30._8_8_ = *(long *)(in_FS_OFFSET + 0x28);
  local_30._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  lVar1 = *(long *)(*(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8
                   + 0x2b0);
  pQVar4 = (QPaintDevice *)(lVar1 + 0x10);
  if (lVar1 == 0) {
    pQVar4 = (QPaintDevice *)0x0;
  }
  QPainter::QPainter((QPainter *)&local_30,pQVar4);
  pQVar2 = (QBrush *)QRegion::begin();
  pQVar3 = (QBrush *)QRegion::end();
  if (pQVar2 != pQVar3) {
    do {
      QPainter::fillRect(&local_30,pQVar2);
      pQVar2 = pQVar2 + 0x10;
    } while (pQVar2 != pQVar3);
  }
  QPainter::~QPainter((QPainter *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30._8_8_) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiArea::paintEvent(QPaintEvent *paintEvent)
{
    Q_D(QMdiArea);
    QPainter painter(d->viewport);
    for (const QRect &exposedRect : paintEvent->region())
        painter.fillRect(exposedRect, d->background);
}